

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  int iVar1;
  undefined4 extraout_var;
  Node *pNVar2;
  iterator iter;
  iterator local_38;
  
  iVar1 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x16])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  find<google::protobuf::MapKey>(&local_38,(InnerMap *)CONCAT44(extraout_var,iVar1),map_key);
  pNVar2 = local_38.node_;
  if (local_38.node_ == (Node *)0x0) {
    pNVar2 = (Node *)Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
                     operator[]<google::protobuf::MapKey_const&>((InnerMap *)&this->map_,map_key);
    AllocateMapValue(this,(MapValueRef *)&pNVar2->field_0x28);
  }
  (val->super_MapValueConstRef).type_ = *(CppType *)&pNVar2->field_0x30;
  (val->super_MapValueConstRef).data_ = *(void **)&pNVar2->field_0x28;
  return local_38.node_ == (Node *)0x0;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(const MapKey& map_key,
                                             MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    MapValueRef& map_val = map_[map_key];
    AllocateMapValue(&map_val);
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}